

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

UColAttributeValue icu_63::CollationRuleParser::getOnOffValue(UnicodeString *s)

{
  UnicodeString *this;
  UBool UVar1;
  ConstChar16Ptr local_b8;
  UnicodeString local_b0;
  ConstChar16Ptr local_60;
  UnicodeString local_58;
  UnicodeString *local_18;
  UnicodeString *s_local;
  
  local_18 = s;
  ConstChar16Ptr::ConstChar16Ptr(&local_60,L"on");
  UnicodeString::UnicodeString(&local_58,'\x01',&local_60,-1);
  UVar1 = UnicodeString::operator==(s,&local_58);
  UnicodeString::~UnicodeString(&local_58);
  ConstChar16Ptr::~ConstChar16Ptr(&local_60);
  this = local_18;
  if (UVar1 == '\0') {
    ConstChar16Ptr::ConstChar16Ptr(&local_b8,L"off");
    UnicodeString::UnicodeString(&local_b0,'\x01',&local_b8,-1);
    UVar1 = UnicodeString::operator==(this,&local_b0);
    UnicodeString::~UnicodeString(&local_b0);
    ConstChar16Ptr::~ConstChar16Ptr(&local_b8);
    if (UVar1 == '\0') {
      s_local._4_4_ = UCOL_DEFAULT;
    }
    else {
      s_local._4_4_ = UCOL_OFF;
    }
  }
  else {
    s_local._4_4_ = UCOL_ON;
  }
  return s_local._4_4_;
}

Assistant:

UColAttributeValue
CollationRuleParser::getOnOffValue(const UnicodeString &s) {
    if(s == UNICODE_STRING_SIMPLE("on")) {
        return UCOL_ON;
    } else if(s == UNICODE_STRING_SIMPLE("off")) {
        return UCOL_OFF;
    } else {
        return UCOL_DEFAULT;
    }
}